

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall leveldb::DBImpl::BackgroundCompaction(DBImpl *this)

{
  int iVar1;
  ManualCompaction *pMVar2;
  InternalKey *this_00;
  pointer ppFVar3;
  FileMetaData *pFVar4;
  InternalKey *this_01;
  Logger *info_log;
  undefined8 uVar5;
  bool bVar6;
  Compaction *this_02;
  CompactionState *compact;
  Status SVar7;
  char *pcVar8;
  Status status;
  InternalKey manual_end;
  LevelSummaryStorage tmp;
  Status local_118;
  Mutex *local_110;
  char *local_108;
  Logger *local_100;
  InternalKey local_f8;
  undefined1 local_d8 [48];
  _func_int *local_a8 [2];
  int local_98;
  undefined4 uStack_94;
  _Alloc_hider local_90;
  
  if (this->imm_ != (MemTable *)0x0) {
    CompactMemTable(this);
    return;
  }
  pMVar2 = this->manual_compaction_;
  local_f8.rep_._M_dataplus._M_p = (pointer)&local_f8.rep_.field_2;
  local_f8.rep_._M_string_length = 0;
  local_f8.rep_.field_2._M_local_buf[0] = '\0';
  if (pMVar2 == (ManualCompaction *)0x0) {
    this_02 = VersionSet::PickCompaction(this->versions_);
    local_118.state_ = (char *)0x0;
    if (this_02 == (Compaction *)0x0) goto LAB_0011361e;
    bVar6 = Compaction::IsTrivialMove(this_02);
    if (!bVar6) goto LAB_00113590;
    ppFVar3 = this_02->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (((long)this_02->inputs_[0].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 & 0x7fffffff8U) != 8) {
      __assert_fail("c->num_input_files(0) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                    ,0x2d9,"void leveldb::DBImpl::BackgroundCompaction()");
    }
    local_110 = &this->mutex_;
    pFVar4 = *ppFVar3;
    local_90._M_p = (pointer)pFVar4->number;
    local_98 = this_02->level_;
    std::
    _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
    ::_M_insert_unique<std::pair<int,unsigned_long>>
              ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                *)&(this_02->edit_).deleted_files_,
               (pair<int,_unsigned_long> *)&stack0xffffffffffffff68);
    VersionEdit::AddFile
              (&this_02->edit_,this_02->level_ + 1,pFVar4->number,pFVar4->file_size,
               &pFVar4->smallest,&pFVar4->largest);
    VersionSet::LogAndApply
              ((VersionSet *)&stack0xffffffffffffff68,(VersionEdit *)this->versions_,
               (Mutex *)&this_02->edit_);
    SVar7.state_ = local_118.state_;
    local_118.state_ = _local_98;
    _local_98 = SVar7.state_;
    if (SVar7.state_ != (char *)0x0) {
      operator_delete__(SVar7.state_);
    }
    if (local_118.state_ != (pointer)0x0) {
      RecordBackgroundError(this,&local_118);
    }
    local_110 = (Mutex *)(this->options_).info_log;
    iVar1 = this_02->level_;
    local_108 = (char *)pFVar4->number;
    local_100 = (Logger *)pFVar4->file_size;
    Status::ToString_abi_cxx11_((string *)(local_d8 + 0x20),&local_118);
    uVar5 = local_d8._32_8_;
    pcVar8 = VersionSet::LevelSummary
                       (this->versions_,(LevelSummaryStorage *)&stack0xffffffffffffff68);
    Log((Logger *)local_110,"Moved #%lld to level-%d %lld bytes %s: %s\n",local_108,
        (ulong)(iVar1 + 1),local_100,uVar5,pcVar8);
    if ((_func_int **)local_d8._32_8_ != local_a8) {
      operator_delete((void *)local_d8._32_8_);
    }
  }
  else {
    this_02 = VersionSet::CompactRange(this->versions_,pMVar2->level,pMVar2->begin,pMVar2->end);
    pMVar2->done = this_02 == (Compaction *)0x0;
    if (this_02 != (Compaction *)0x0) {
      std::__cxx11::string::_M_assign((string *)&local_f8);
    }
    local_100 = (this->options_).info_log;
    local_110 = (Mutex *)CONCAT44(local_110._4_4_,pMVar2->level);
    this_00 = pMVar2->begin;
    if (this_00 == (InternalKey *)0x0) {
      local_108 = "(begin)";
    }
    else {
      InternalKey::DebugString_abi_cxx11_((string *)&stack0xffffffffffffff68,this_00);
      local_108 = _local_98;
    }
    this_01 = pMVar2->end;
    if (this_01 == (InternalKey *)0x0) {
      pcVar8 = "(end)";
    }
    else {
      InternalKey::DebugString_abi_cxx11_((string *)(local_d8 + 0x20),this_01);
      pcVar8 = (char *)local_d8._32_8_;
    }
    if (pMVar2->done == false) {
      InternalKey::DebugString_abi_cxx11_((string *)local_d8,&local_f8);
      Log(local_100,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",
          (ulong)local_110 & 0xffffffff,local_108,pcVar8,local_d8._0_8_);
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    else {
      Log(local_100,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",
          (ulong)local_110 & 0xffffffff,local_108,pcVar8,"(end)");
    }
    if ((this_01 != (InternalKey *)0x0) && ((_func_int **)local_d8._32_8_ != local_a8)) {
      operator_delete((void *)local_d8._32_8_);
    }
    if ((this_00 != (InternalKey *)0x0) && (_local_98 != &stack0xffffffffffffff78)) {
      operator_delete(_local_98);
    }
    local_118.state_ = (char *)0x0;
    if (this_02 == (Compaction *)0x0) {
LAB_0011361e:
      local_118.state_ = (pointer)0x0;
      this_02 = (Compaction *)0x0;
      goto LAB_00113621;
    }
LAB_00113590:
    compact = (CompactionState *)operator_new(0x40);
    compact->compaction = this_02;
    compact->smallest_snapshot = 0;
    (compact->outputs).
    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (compact->outputs).
    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (compact->outputs).
    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    compact->outfile = (WritableFile *)0x0;
    compact->builder = (TableBuilder *)0x0;
    compact->total_bytes = 0;
    DoCompactionWork((DBImpl *)local_d8,(CompactionState *)this);
    SVar7.state_ = local_118.state_;
    local_118.state_ = (char *)local_d8._0_8_;
    if (SVar7.state_ != (char *)0x0) {
      operator_delete__(SVar7.state_);
    }
    if (local_118.state_ != (pointer)0x0) {
      RecordBackgroundError(this,&local_118);
    }
    CleanupCompaction(this,compact);
    Compaction::ReleaseInputs(this_02);
    RemoveObsoleteFiles(this);
  }
  Compaction::~Compaction(this_02);
LAB_00113621:
  operator_delete(this_02);
  if (local_118.state_ == (pointer)0x0) {
    SVar7.state_ = (pointer)0x0;
  }
  else {
    SVar7.state_ = local_118.state_;
    if (((this->shutting_down_)._M_base._M_i & 1U) == 0) {
      info_log = (this->options_).info_log;
      Status::ToString_abi_cxx11_((string *)local_d8,&local_118);
      Log(info_log,"Compaction error: %s",local_d8._0_8_);
      SVar7.state_ = local_118.state_;
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_);
        SVar7.state_ = local_118.state_;
      }
    }
  }
  if (pMVar2 != (ManualCompaction *)0x0) {
    pMVar2 = this->manual_compaction_;
    if (SVar7.state_ == (pointer)0x0) {
      if ((pMVar2->done & 1U) == 0) {
        std::__cxx11::string::_M_assign((string *)&pMVar2->tmp_storage);
        pMVar2->begin = &pMVar2->tmp_storage;
        SVar7.state_ = local_118.state_;
      }
      else {
        SVar7.state_ = (pointer)0x0;
      }
    }
    else {
      pMVar2->done = true;
    }
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  if (SVar7.state_ != (pointer)0x0) {
    operator_delete__(SVar7.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.rep_._M_dataplus._M_p != &local_f8.rep_.field_2) {
    operator_delete(local_f8.rep_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DBImpl::BackgroundCompaction() {
  mutex_.AssertHeld();

  if (imm_ != nullptr) {
    CompactMemTable();
    return;
  }

  Compaction* c;
  bool is_manual = (manual_compaction_ != nullptr);
  InternalKey manual_end;
  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    c = versions_->CompactRange(m->level, m->begin, m->end);
    m->done = (c == nullptr);
    if (c != nullptr) {
      manual_end = c->input(0, c->num_input_files(0) - 1)->largest;
    }
    Log(options_.info_log,
        "Manual compaction at level-%d from %s .. %s; will stop at %s\n",
        m->level, (m->begin ? m->begin->DebugString().c_str() : "(begin)"),
        (m->end ? m->end->DebugString().c_str() : "(end)"),
        (m->done ? "(end)" : manual_end.DebugString().c_str()));
  } else {
    c = versions_->PickCompaction();
  }

  Status status;
  if (c == nullptr) {
    // Nothing to do
  } else if (!is_manual && c->IsTrivialMove()) {
    // Move file to next level
    assert(c->num_input_files(0) == 1);
    FileMetaData* f = c->input(0, 0);
    c->edit()->RemoveFile(c->level(), f->number);
    c->edit()->AddFile(c->level() + 1, f->number, f->file_size, f->smallest,
                       f->largest);
    status = versions_->LogAndApply(c->edit(), &mutex_);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    VersionSet::LevelSummaryStorage tmp;
    Log(options_.info_log, "Moved #%lld to level-%d %lld bytes %s: %s\n",
        static_cast<unsigned long long>(f->number), c->level() + 1,
        static_cast<unsigned long long>(f->file_size),
        status.ToString().c_str(), versions_->LevelSummary(&tmp));
  } else {
    CompactionState* compact = new CompactionState(c);
    status = DoCompactionWork(compact);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    CleanupCompaction(compact);
    c->ReleaseInputs();
    RemoveObsoleteFiles();
  }
  delete c;

  if (status.ok()) {
    // Done
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // Ignore compaction errors found during shutting down
  } else {
    Log(options_.info_log, "Compaction error: %s", status.ToString().c_str());
  }

  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    if (!status.ok()) {
      m->done = true;
    }
    if (!m->done) {
      // We only compacted part of the requested range.  Update *m
      // to the range that is left to be compacted.
      m->tmp_storage = manual_end;
      m->begin = &m->tmp_storage;
    }
    manual_compaction_ = nullptr;
  }
}